

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_0::ValidateOperandDebugType
          (ValidationState_t *_,string *debug_inst_name,Instruction *inst,uint32_t word_index,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *ext_inst_name,bool allow_template_param)

{
  pointer puVar1;
  bool bVar2;
  byte bVar3;
  Instruction *pIVar4;
  spv_result_t sVar5;
  function<bool_(CommonDebugInfoInstructions)> expectation;
  function<bool_(NonSemanticShaderDebugInfo100Instructions)> expectation_1;
  undefined1 local_251;
  string *local_250;
  _Any_data local_248;
  code *local_238;
  code *pcStack_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [24];
  code *local_1f0;
  spv_result_t local_38;
  
  local_251 = allow_template_param;
  if ((inst->inst_).ext_inst_type == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
    local_208._0_8_ = 0;
    local_208._8_8_ = 0;
    local_1f0 = std::
                _Function_handler<bool_(NonSemanticShaderDebugInfo100Instructions),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_extensions.cpp:258:9)>
                ::_M_invoke;
    local_208._16_8_ =
         std::
         _Function_handler<bool_(NonSemanticShaderDebugInfo100Instructions),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_extensions.cpp:258:9)>
         ::_M_manager;
    puVar1 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar3 = 1;
    local_250 = debug_inst_name;
    if ((ulong)word_index <
        (ulong)((long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2)) {
      pIVar4 = ValidationState_t::FindDef(_,puVar1[word_index]);
      bVar2 = spvIsExtendedInstruction((uint)(pIVar4->inst_).opcode);
      if ((bVar2) &&
         ((pIVar4->inst_).ext_inst_type == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100)) {
        local_248._0_4_ =
             (pIVar4->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start[4];
        if ((code *)local_208._16_8_ == (code *)0x0) goto LAB_0067f88d;
        bVar3 = (*local_1f0)(local_208,&local_248);
        bVar3 = bVar3 ^ 1;
      }
    }
    if ((code *)local_208._16_8_ != (code *)0x0) {
      (*(code *)local_208._16_8_)(local_208,local_208,3);
    }
    debug_inst_name = local_250;
    if (bVar3 == 0) {
      return SPV_SUCCESS;
    }
  }
  local_248._8_8_ = 0;
  local_248._M_unused._M_object = &local_251;
  pcStack_230 = std::
                _Function_handler<bool_(CommonDebugInfoInstructions),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_extensions.cpp:267:7)>
                ::_M_invoke;
  local_238 = std::
              _Function_handler<bool_(CommonDebugInfoInstructions),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_extensions.cpp:267:7)>
              ::_M_manager;
  bVar2 = DoesDebugInfoOperandMatchExpectation
                    (_,(function<bool_(CommonDebugInfoInstructions)> *)&local_248,inst,word_index);
  sVar5 = SPV_SUCCESS;
  if (!bVar2) {
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    if ((ext_inst_name->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_0067f88d:
      std::__throw_bad_function_call();
    }
    (*ext_inst_name->_M_invoker)(&local_228,(_Any_data *)ext_inst_name);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,local_228._M_dataplus._M_p,local_228._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"expected operand ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,(debug_inst_name->_M_dataplus)._M_p,
               debug_inst_name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208," is not a valid debug type",0x1a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    sVar5 = local_38;
  }
  if (local_238 != (code *)0x0) {
    (*local_238)(&local_248,&local_248,__destroy_functor);
  }
  return sVar5;
}

Assistant:

spv_result_t ValidateOperandDebugType(
    ValidationState_t& _, const std::string& debug_inst_name,
    const Instruction* inst, uint32_t word_index,
    const std::function<std::string()>& ext_inst_name,
    bool allow_template_param) {
  // Check for NonSemanticShaderDebugInfo100 specific types.
  if (inst->ext_inst_type() ==
      SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
    std::function<bool(NonSemanticShaderDebugInfo100Instructions)> expectation =
        [](NonSemanticShaderDebugInfo100Instructions dbg_inst) {
          return dbg_inst == NonSemanticShaderDebugInfo100DebugTypeMatrix;
        };
    if (DoesDebugInfoOperandMatchExpectation(_, expectation, inst, word_index))
      return SPV_SUCCESS;
  }

  // Check for common types.
  std::function<bool(CommonDebugInfoInstructions)> expectation =
      [&allow_template_param](CommonDebugInfoInstructions dbg_inst) {
        if (allow_template_param &&
            (dbg_inst == CommonDebugInfoDebugTypeTemplateParameter ||
             dbg_inst == CommonDebugInfoDebugTypeTemplateTemplateParameter)) {
          return true;
        }
        return CommonDebugInfoDebugTypeBasic <= dbg_inst &&
               dbg_inst <= CommonDebugInfoDebugTypeTemplate;
      };
  if (DoesDebugInfoOperandMatchExpectation(_, expectation, inst, word_index))
    return SPV_SUCCESS;

  return _.diag(SPV_ERROR_INVALID_DATA, inst)
         << ext_inst_name() << ": "
         << "expected operand " << debug_inst_name
         << " is not a valid debug type";
}